

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_hlp(Decompiler *this,uint16_t read_index)

{
  byte bVar1;
  char local_1b;
  ushort local_1a;
  bool local_17;
  ushort local_16;
  char local_13;
  uint16_t i;
  bool after_tail_wildcard;
  uint16_t arity;
  Decompiler *pDStack_10;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  this->in_hlp = true;
  i = read_index;
  pDStack_10 = this;
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_13 = '(';
  OutStream::push<char>(this->out_stream,&local_13,i);
  write_expression_head(this,i);
  OutStream::operator<<(this->out_stream,(char (*) [2])0x1ca3ad);
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)i);
  bVar1 = r_code::Atom::getAtomCount();
  local_16 = (ushort)bVar1;
  local_17 = false;
  for (local_1a = 0; local_1a < local_16; local_1a = local_1a + 1) {
    if ((local_17 & 1U) == 0) {
      if ((this->closing_set & 1U) != 0) {
        this->closing_set = false;
        write_indent(this,this->indents);
      }
      if ((local_1a == 0) || (local_1a == 1)) {
        this->hlp_postfix = true;
      }
      i = i + 1;
      write_any(this,i,&local_17,false,0);
      this->hlp_postfix = false;
      if ((this->closing_set & 1U) == 0) {
        OutStream::operator<<(this->out_stream,(char (*) [2])0x1ca3d6);
      }
    }
    else {
      i = i + 1;
      write_any(this,i,&local_17,false,0);
    }
  }
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_1b = ')';
  OutStream::operator<<(this->out_stream,&local_1b);
  this->in_hlp = false;
  return;
}

Assistant:

void Decompiler::write_hlp(uint16_t read_index)
{
    in_hlp = true;

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    *out_stream << " ";
    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, false);
        } else {
            if (closing_set) {
                closing_set = false;
                write_indent(indents);
            }

            if (i == 0 || i == 1) {
                hlp_postfix = true;
            }

            write_any(++read_index, after_tail_wildcard, false);
            hlp_postfix = false;

            if (!closing_set) {
                *out_stream << "\n";
            }
        }
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
    in_hlp = false;
}